

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O3

void __thiscall chrono::utils::ChChaseCamera::SetState(ChChaseCamera *this,State s)

{
  double dVar1;
  ChVector<double> local_28;
  
  if (this->m_state == Free) {
    this->m_mult = 1.0;
    this->m_angle = 0.0;
  }
  dVar1 = (this->m_loc).m_data[1];
  (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
  (this->m_lastLoc).m_data[1] = dVar1;
  (this->m_lastLoc).m_data[2] = (this->m_loc).m_data[2];
  this->m_state = s;
  if (s == Free) {
    GetCameraPos(&local_28,this);
    (this->m_loc).m_data[0] = local_28.m_data[0];
    (this->m_loc).m_data[1] = local_28.m_data[1];
    (this->m_loc).m_data[2] = local_28.m_data[2];
    this->m_mult = (double)SUB168(ZEXT816(0) << 0x20,0);
    this->m_angle = (double)SUB168(ZEXT816(0) << 0x20,8);
  }
  else if (s == Chase) {
    this->m_angle = 0.0;
  }
  return;
}

Assistant:

void ChChaseCamera::SetState(State s) {
    if (m_state == Free) {
        m_mult = 1;
        m_angle = 0;
    }

    m_lastLoc = m_loc;
    m_state = s;

    if (m_state == Chase) {
        m_angle = 0;
    }
    if (m_state == Free) {
        m_loc = GetCameraPos();
        m_mult = 0;
        m_angle = 0;
    }
}